

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O1

void rlib::string::inner::f<char,int,wchar_t_const(&)[3]>
               (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *format,int *head,
               wchar_t (*tail) [3])

{
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *self;
  put_holder<char,_std::char_traits<char>_> local_28;
  
  local_28.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,int>;
  local_28.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,int>;
  local_28.arg = head;
  self = boost::io::detail::
         feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                   (format,&local_28);
  local_28.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,wchar_t_const[3]>
  ;
  local_28.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,wchar_t_const[3]>
  ;
  local_28.arg = tail;
  boost::io::detail::
  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
            (self,&local_28);
  return;
}

Assistant:

void f(boost::basic_format<CharT>& format, Head& head, Tail&&... tail) {
				using HeadT = std::remove_const_t<Head>;
				if constexpr (IsUniquePtr<HeadT>::value || IsSharedPtr<HeadT>::value || IsOptional<HeadT>::value) {
					if (head) {
						f<CharT>(format, *head, tail...);
					} else {
						f<CharT>(format % "(null)", tail...);
					}
				} else if constexpr (IsPair<HeadT>::value) {
					f<CharT>(format, head.first, head.second, tail...);
				} else if constexpr (IsTuple<HeadT>::value) {
					f<0, CharT>(format, head, tail...);
				} else if constexpr (IsArray<HeadT>::value || IsVector<HeadT>::value || IsList<HeadT>::value || IsDeque<HeadT>::value
					|| IsInitializerList<HeadT>::value || IsSet<HeadT>::value || IsMultiSet<HeadT>::value
					|| IsMap<HeadT>::value || IsMultiMap<HeadT>::value)		// 範囲ループ可の型か？っていう便利記述がもしあるなら知りたい
				{
					for (const auto& i : head) {
						f<CharT>(format, i);
					}
					f<CharT>(format, tail...);
#ifdef _MSC_VER
				} else if constexpr (std::is_same_v<HeadT, CStringA> || std::is_same_v<HeadT, CStringW>) {
					f<CharT>(format % std::basic_string<CharT>(head.GetString()), tail...);
#endif
				} else {
					f<CharT>(format % head, tail...);
				}
			}